

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShoppingCart.cpp
# Opt level: O1

double __thiscall ShoppingCart::getTotalAmount(ShoppingCart *this)

{
  int iVar1;
  Product *this_00;
  ShoppingCart *pSVar2;
  double dVar3;
  double dVar4;
  
  pSVar2 = (ShoppingCart *)
           (this->productToPurchase).
           super__List_base<ProductToPurchase_*,_std::allocator<ProductToPurchase_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (pSVar2 == this) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    do {
      iVar1 = ProductToPurchase::getQuantity
                        ((ProductToPurchase *)
                         (pSVar2->productToPurchase).
                         super__List_base<ProductToPurchase_*,_std::allocator<ProductToPurchase_*>_>
                         ._M_impl._M_node._M_size);
      this_00 = ProductToPurchase::getProduct
                          ((ProductToPurchase *)
                           (pSVar2->productToPurchase).
                           super__List_base<ProductToPurchase_*,_std::allocator<ProductToPurchase_*>_>
                           ._M_impl._M_node._M_size);
      dVar3 = Product::getPrice(this_00);
      dVar4 = dVar4 + dVar3 * (double)iVar1;
      pSVar2 = (ShoppingCart *)
               (pSVar2->productToPurchase).
               super__List_base<ProductToPurchase_*,_std::allocator<ProductToPurchase_*>_>._M_impl.
               _M_node.super__List_node_base._M_next;
    } while (pSVar2 != this);
  }
  return dVar4;
}

Assistant:

double ShoppingCart::getTotalAmount() {
    double total = 0;
    list<ProductToPurchase*>::iterator it;
    for(it=productToPurchase.begin(); it!=productToPurchase.end(); it++){
        total += (*it)->getQuantity() * (*it)->getProduct()->getPrice();
    }
    return total;
}